

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

void generateGradientTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  char cVar1;
  ostream *poVar2;
  Scalar_ local_190 [8];
  Mat gradient_texture;
  int local_130 [2];
  Scalar gradient_color_1;
  undefined1 local_110 [8];
  Scalar gradient_color_2;
  _InputArray local_f0;
  string local_d8;
  string local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  undefined1 local_80 [8];
  string material_name;
  string img_name;
  string img_filename;
  
  local_80 = (undefined1  [8])&material_name._M_string_length;
  material_name._M_dataplus._M_p = (pointer)0x0;
  material_name.field_2._8_8_ = &img_name._M_string_length;
  img_name._M_dataplus._M_p = (pointer)0x0;
  img_name.field_2._8_8_ = &img_filename._M_string_length;
  img_filename._M_dataplus._M_p = (pointer)0x0;
  material_name._M_string_length._0_1_ = 0;
  img_name._M_string_length._0_1_ = 0;
  img_filename._M_string_length._0_1_ = 0;
  genNames("gradient_",*i,textures_dir,(string *)local_80,
           (string *)((long)&material_name.field_2 + 8),(string *)((long)&img_name.field_2 + 8));
  std::__cxx11::string::string((string *)&local_d8,(string *)local_80);
  std::__cxx11::string::string
            ((string *)&local_b8,(string *)(material_name.field_2._M_local_buf + 8));
  genScript(&local_d8,&local_b8,scripts_dir);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  local_f0.flags = *resolution;
  PatternGeneration::getGradientTexture
            (local_190,(Scalar_ *)pattern_generation,local_130,SUB81(local_110,0));
  local_f0.sz.width = 0;
  local_f0.sz.height = 0;
  local_f0.flags = 0x1010000;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.obj = local_190;
  cVar1 = cv::imwrite((string *)(img_name.field_2._M_local_buf + 8),&local_f0,(vector *)&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  if (cVar1 != '\0') {
    cv::Mat::~Mat((Mat *)local_190);
    std::__cxx11::string::~string((string *)(img_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(material_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_80);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[ERROR] Could not save ");
  poVar2 = std::operator<<(poVar2,(string *)(img_name.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,". Please ensure the destination folder exists!");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void generateGradientTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("gradient_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    cv::Scalar gradient_color_1 = pattern_generation.getRandomColor();
    cv::Scalar gradient_color_2 = pattern_generation.getRandomColor();
    cv::Mat gradient_texture = pattern_generation.getGradientTexture(gradient_color_1, gradient_color_2, resolution, false);

    if (!cv::imwrite(img_filename, gradient_texture)){
    std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Gradient texture", gradient_texture);
}